

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O0

void __thiscall dg::dda::RWNodeCall::_summarizeAnnotation(RWNodeCall *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  RWNode *pRVar3;
  reference ppRVar4;
  DefSiteSet *pDVar5;
  reference ppRVar6;
  value_type *in_RDI;
  RWNode *u;
  iterator __end5;
  iterator __begin5;
  vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *__range5;
  size_t i;
  DefSiteSet kills;
  RWNode *uc;
  RWCalledValue *cv;
  const_iterator __end3;
  const_iterator __begin3;
  CalleesT *__range3;
  vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> undefined;
  Annotations *in_stack_ffffffffffffff18;
  DefSiteSet *this_01;
  Annotations *in_stack_ffffffffffffff20;
  DefSiteSetT *this_02;
  RWNode *in_stack_ffffffffffffff30;
  __normal_iterator<const_dg::dda::RWNode_**,_std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>_>
  local_c0;
  DefSiteSet *in_stack_ffffffffffffff50;
  DefSiteSet *local_80;
  __normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  local_30;
  value_type *local_28;
  
  sVar2 = std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::size
                    ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                     (in_RDI + 0x2b));
  if (1 < sVar2) {
    std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::vector
              ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)0x190b5f
              );
    local_28 = in_RDI + 0x2b;
    local_30._M_current =
         (RWCalledValue *)
         std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                   ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                    in_stack_ffffffffffffff18);
    std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
              ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
               in_stack_ffffffffffffff18);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                               *)in_stack_ffffffffffffff20,
                              (__normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                               *)in_stack_ffffffffffffff18), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                ::operator*(&local_30);
      pRVar3 = RWCalledValue::getCalledValue(this_00);
      if (pRVar3 != (RWNode *)0x0) {
        std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::push_back
                  ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
                   in_stack_ffffffffffffff30,in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
      ::operator++(&local_30);
    }
    sVar2 = std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::size
                      ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
                       &stack0xffffffffffffffe0);
    if (sVar2 == 1) {
      std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::operator[]
                ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
                 &stack0xffffffffffffffe0,0);
      RWNode::Annotations::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    else {
      sVar2 = std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::size
                        ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                          *)&stack0xffffffffffffffe0);
      if (1 < sVar2) {
        ppRVar4 = std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::
                  operator[]((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                              *)&stack0xffffffffffffffe0,0);
        this_02 = &((*ppRVar4)->annotations).overwrites;
        std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::operator[]
                  ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
                   &stack0xffffffffffffffe0,1);
        DefSiteSet::intersect((DefSiteSet *)cv,(DefSiteSet *)uc);
        local_80 = (DefSiteSet *)0x2;
        while (this_01 = local_80,
              pDVar5 = (DefSiteSet *)
                       std::
                       vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::
                       size((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                             *)&stack0xffffffffffffffe0), this_01 < pDVar5) {
          std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::operator[]
                    ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
                     &stack0xffffffffffffffe0,(size_type)local_80);
          DefSiteSet::intersect((DefSiteSet *)cv,(DefSiteSet *)uc);
          DefSiteSet::operator=(this_02,this_01);
          DefSiteSet::~DefSiteSet((DefSiteSet *)0x190d32);
          local_80 = (DefSiteSet *)
                     &(local_80->
                      super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                      )._M_t._M_impl.field_0x1;
        }
        DefSiteSet::operator=(this_02,this_01);
        pDVar5 = (DefSiteSet *)&stack0xffffffffffffffe0;
        local_c0._M_current =
             (RWNode **)
             std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::begin
                       ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *
                        )this_01);
        std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::end
                  ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
                   this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_dg::dda::RWNode_**,_std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>_>
                                   *)this_02,
                                  (__normal_iterator<const_dg::dda::RWNode_**,_std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>_>
                                   *)this_01), bVar1) {
          ppRVar6 = __gnu_cxx::
                    __normal_iterator<const_dg::dda::RWNode_**,_std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>_>
                    ::operator*(&local_c0);
          in_stack_ffffffffffffff30 = *ppRVar6;
          DefSiteSet::add<dg::dda::DefSiteSet>(in_stack_ffffffffffffff50,pDVar5);
          DefSiteSet::add<dg::dda::DefSiteSet>(in_stack_ffffffffffffff50,pDVar5);
          __gnu_cxx::
          __normal_iterator<const_dg::dda::RWNode_**,_std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>_>
          ::operator++(&local_c0);
        }
        DefSiteSet::~DefSiteSet((DefSiteSet *)0x190e06);
      }
    }
    std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::~vector
              ((vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *)
               in_stack_ffffffffffffff30);
  }
  *(undefined1 *)(in_RDI + 0x34) = 1;
  return;
}

Assistant:

void _summarizeAnnotation() const {
        if (callees.size() > 1) {
            std::vector<const RWNode *> undefined;
            for (const auto &cv : callees) {
                if (const auto *uc = cv.getCalledValue()) {
                    undefined.push_back(uc);
                }
            }

            if (undefined.size() == 1) {
                annotations = undefined[0]->annotations;
            } else if (undefined.size() > 1) {
                auto kills = undefined[0]->annotations.overwrites.intersect(
                        undefined[1]->annotations.overwrites);
                for (size_t i = 2; i < undefined.size(); ++i) {
                    kills = kills.intersect(
                            undefined[i]->annotations.overwrites);
                }

                annotations.overwrites = kills;
                for (const auto *u : undefined) {
                    annotations.defs.add(u->annotations.defs);
                    annotations.uses.add(u->annotations.uses);
                }
            }
        }
        _annotations_summarized = true;
    }